

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfXdr.h
# Opt level: O2

void Imf_3_4::Xdr::write<Imf_3_4::CharPtrIO,char*>(char **out,int v)

{
  char b [4];
  
  CharPtrIO::writeChars(out,b,4);
  return;
}

Assistant:

void
write (T& out, signed int v)
{
    signed char b[4];

    b[0] = (signed char) (v);
    b[1] = (signed char) (v >> 8);
    b[2] = (signed char) (v >> 16);
    b[3] = (signed char) (v >> 24);

    writeSignedChars<S> (out, b, 4);
}